

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

uint32_t prf_model_vertex_palette_get_next_index(prf_model_t *model,uint32_t idx)

{
  uint *puVar1;
  uint32_t uVar2;
  uint uVar3;
  
  puVar1 = (uint *)model->vertex_palette->data;
  uVar3 = *(ushort *)((long)puVar1 + (ulong)idx + 2) + idx;
  uVar2 = 0;
  if (uVar3 < *puVar1) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

uint32_t
prf_model_vertex_palette_get_next_index(
    prf_model_t * model,
    uint32_t idx )
{
    uint32_t length;
    assert( model != NULL && idx >= 8 && ! (idx & 3) );
    assert( model->vertex_palette != NULL );

    length = ((uint32_t *)(model->vertex_palette->data))[0];
    assert( idx < length );
    idx = idx + ((uint16_t *)(model->vertex_palette->data + idx))[1];
    if ( idx >= length ) return 0;
    return idx;
}